

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaBalLut.c
# Opt level: O2

void Bal_ManFree(Bal_Man_t *p)

{
  Vec_Ptr_t *p_00;
  Vec_Int_t *__ptr;
  void *__ptr_00;
  int i;
  int i_00;
  
  p_00 = p->vCutSets;
  if (p_00 != (Vec_Ptr_t *)0x0) {
    for (i_00 = 0; i_00 < p_00->nSize; i_00 = i_00 + 1) {
      __ptr_00 = Vec_PtrEntry(p_00,i_00);
      if ((void *)0x2 < __ptr_00) {
        free(__ptr_00);
      }
    }
    free(p_00->pArray);
    free(p_00);
  }
  __ptr = p->vCosts;
  free(__ptr->pArray);
  free(__ptr);
  free(p);
  return;
}

Assistant:

void Bal_ManFree( Bal_Man_t * p )
{
    Vec_PtrFreeFree( p->vCutSets );
    Vec_IntFree( p->vCosts );
    ABC_FREE( p );
}